

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

ConstantDataArray * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::ConstantDataArray,LLVMBC::Type*,std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>>
          (LLVMContext *this,Type **u,
          vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *u_1)

{
  Type *type;
  ConstantDataArray *this_00;
  Vector<Value_*> local_38;
  
  this_00 = (ConstantDataArray *)allocate(this,0x50,8);
  if (this_00 != (ConstantDataArray *)0x0) {
    type = *u;
    local_38.super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (u_1->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_38.super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (u_1->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_38.super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (u_1->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (u_1->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (u_1->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (u_1->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ConstantDataArray::ConstantDataArray(this_00,type,&local_38);
    if (local_38.
        super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      ::dxil_spv::free_in_thread
                (local_38.
                 super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    append_typed_destructor<LLVMBC::ConstantDataArray>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}